

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::addToMatrix(HPresolve *this,HighsInt row,HighsInt col,double val)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  uint *puVar4;
  reference pvVar5;
  reference pvVar6;
  uint in_EDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__to;
  uint in_ESI;
  HPresolve *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa;
  double sum;
  HighsInt pos;
  value_type_conflict2 *in_stack_ffffffffffffff68;
  HighsLinearSumBounds *pHVar8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  HighsInt row_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffc8;
  HighsInt HVar9;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HighsInt in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  HVar9 = (HighsInt)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar2 = findNonzero((HPresolve *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (HighsInt)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (HighsInt)in_stack_ffffffffffffff90);
  markChangedRow((HPresolve *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  markChangedCol((HPresolve *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  if (uVar2 == 0xffffffff) {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (bVar1) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->Avalue);
      uVar2 = (uint)sVar3;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (value_type_conflict2 *)in_stack_ffffffffffffff78);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (value_type_conflict2 *)in_stack_ffffffffffffff78);
      row_00 = (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      in_stack_ffffffffffffffd4 = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      __to = extraout_RDX;
    }
    else {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::back
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      row_00 = (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      uVar2 = *puVar4;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x6fa18a);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Avalue,(long)(int)uVar2);
      *pvVar5 = in_XMM0_Qa;
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->Arow,(long)(int)uVar2);
      *puVar4 = in_ESI;
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->Acol,(long)(int)uVar2);
      *puVar4 = in_EDX;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Aprev,(long)(int)uVar2);
      *pvVar6 = -1;
      __to = extraout_RDX_00;
    }
    link(in_RDI,(char *)(ulong)uVar2,__to);
    resetRowDualImpliedBoundsDerivedFromCol
              ((HPresolve *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),HVar9);
    resetColImpliedBoundsDerivedFromRow
              ((HPresolve *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),HVar9);
    clearLiftingOpportunities
              ((HPresolve *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),row_00);
  }
  else {
    this_00 = &in_RDI->Avalue;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)(int)uVar2);
    HVar9 = (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    dVar7 = *pvVar5 + in_XMM0_Qa;
    std::abs((int)this_00);
    if ((in_RDI->options->super_HighsOptionsStruct).small_matrix_value < extraout_XMM0_Qa) {
      resetRowDualImpliedBoundsDerivedFromCol
                ((HPresolve *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (HighsInt)((ulong)dVar7 >> 0x20));
      resetColImpliedBoundsDerivedFromRow
                ((HPresolve *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (HighsInt)((ulong)dVar7 >> 0x20));
      clearLiftingOpportunities
                ((HPresolve *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),HVar9);
      pHVar8 = &in_RDI->impliedRowBounds;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)(int)uVar2);
      HighsLinearSumBounds::remove(pHVar8,(char *)(ulong)in_ESI);
      pHVar8 = &in_RDI->impliedDualRowBounds;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)(int)uVar2);
      HighsLinearSumBounds::remove(pHVar8,(char *)(ulong)in_EDX);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->Avalue,(long)(int)uVar2);
      *pvVar5 = dVar7;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)(int)uVar2);
      HighsLinearSumBounds::add
                ((HighsLinearSumBounds *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                 (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)(int)uVar2);
      HighsLinearSumBounds::add
                ((HighsLinearSumBounds *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                 (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      unlink(in_RDI,(char *)(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void HPresolve::addToMatrix(const HighsInt row, const HighsInt col,
                            const double val) {
  HighsInt pos = findNonzero(row, col);

  markChangedRow(row);
  markChangedCol(col);

  if (pos == -1) {
    if (freeslots.empty()) {
      pos = Avalue.size();
      Avalue.push_back(val);
      Arow.push_back(row);
      Acol.push_back(col);
      Anext.push_back(-1);
      Aprev.push_back(-1);
      ARleft.push_back(-1);
      ARright.push_back(-1);
    } else {
      pos = freeslots.back();
      freeslots.pop_back();
      Avalue[pos] = val;
      Arow[pos] = row;
      Acol[pos] = col;
      Aprev[pos] = -1;
    }

    link(pos);

    // remove implied bounds on row duals that where implied by this column's
    // dual constraint
    resetRowDualImpliedBoundsDerivedFromCol(col);

    // remove implied bounds on columns that where implied by this row
    resetColImpliedBoundsDerivedFromRow(row);

    // modifications to row invalidate lifting opportunities
    clearLiftingOpportunities(row);

  } else {
    double sum = Avalue[pos] + val;
    if (std::abs(sum) <= options->small_matrix_value) {
      unlink(pos);
    } else {
      // remove implied bounds on row duals that where implied by this column's
      // dual constraint
      resetRowDualImpliedBoundsDerivedFromCol(col);

      // remove implied bounds on columns that where implied by this row
      resetColImpliedBoundsDerivedFromRow(row);

      // modifications to row invalidate lifting opportunities
      clearLiftingOpportunities(row);

      // remove the locks and contribution to implied (dual) row bounds, then
      // add then again
      impliedRowBounds.remove(row, col, Avalue[pos]);
      impliedDualRowBounds.remove(col, row, Avalue[pos]);
      Avalue[pos] = sum;
      // value not zero, add new contributions and locks with opposite sign
      impliedRowBounds.add(row, col, Avalue[pos]);
      impliedDualRowBounds.add(col, row, Avalue[pos]);
    }
  }
}